

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::invalid_option_format_error::invalid_option_format_error
          (invalid_option_format_error *this,string *format)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *format_local;
  invalid_option_format_error *this_local;
  
  local_18 = format;
  format_local = (string *)this;
  std::operator+(&local_78,"Invalid option format ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::LQUOTE_abi_cxx11_);
  std::operator+(&local_58,&local_78,local_18);
  std::operator+(&local_38,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::RQUOTE_abi_cxx11_);
  OptionSpecException::OptionSpecException(&this->super_OptionSpecException,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  *(undefined ***)&(this->super_OptionSpecException).super_OptionException =
       &PTR__invalid_option_format_error_0019b0b0;
  return;
}

Assistant:

invalid_option_format_error(const std::string& format)
    : OptionSpecException("Invalid option format " + LQUOTE + format + RQUOTE)
    {
    }